

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_stops.c
# Opt level: O0

greatest_test_res stop_compare(void)

{
  int iVar1;
  undefined1 local_b28 [8];
  stop_t c;
  stop_t b;
  stop_t a;
  greatest_test_res local_c;
  
  memcpy(&b.field_0x3a8,&DAT_0024e790,0x3b0);
  memcpy(&c.field_0x3a8,&DAT_0024eb40,0x3b0);
  memcpy(local_b28,&DAT_0024eef0,0x3b0);
  greatest_info.assertions = greatest_info.assertions + 1;
  iVar1 = equal_stop((stop_t *)&b.field_0x3a8,(stop_t *)&c.field_0x3a8);
  if (iVar1 == 1) {
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_stop((stop_t *)&b.field_0x3a8,(stop_t *)local_b28);
    if (iVar1 == 0) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_stop((stop_t *)&c.field_0x3a8,(stop_t *)local_b28);
      if (iVar1 == 0) {
        greatest_info.msg = (char *)0x0;
        local_c = GREATEST_TEST_RES_PASS;
      }
      else {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_stops.c"
        ;
        greatest_info.fail_line = 100;
        greatest_info.msg = "0 != equal_stop(&b, &c)";
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
        local_c = GREATEST_TEST_RES_FAIL;
      }
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_stops.c"
      ;
      greatest_info.fail_line = 99;
      greatest_info.msg = "0 != equal_stop(&a, &c)";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      local_c = GREATEST_TEST_RES_FAIL;
    }
  }
  else {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_stops.c"
    ;
    greatest_info.fail_line = 0x62;
    greatest_info.msg = "1 != equal_stop(&a, &b)";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    local_c = GREATEST_TEST_RES_FAIL;
  }
  return local_c;
}

Assistant:

TEST stop_compare(void) {
    stop_t a = {
        .id = "STP1",
        .code = "S1",
        .name = "stop",
        .desc = "some stop",
        .lat = 0.9,
        .lon = 9.0,
        .zone_id = "Zone 51",
        .url = "none",
        .location_type = LT_STOP,
        .parent_station = "",
        .timezone = "Europe/Helsinki",
        .wheelchair_boarding = WB_NOT_SET,
        .level_id = "LVL01",
        .platform_code = "A"
    };

    stop_t b = {
        .id = "STP1",
        .code = "S1",
        .name = "stop",
        .desc = "some stop",
        .lat = 0.9,
        .lon = 9.0,
        .zone_id = "Zone 51",
        .url = "none",
        .location_type = LT_STOP,
        .parent_station = "",
        .timezone = "Europe/Helsinki",
        .wheelchair_boarding = WB_NOT_SET,
        .level_id = "LVL01",
        .platform_code = "A"
    };

    stop_t c = {
        .id = "STP0",
        .code = "S1",
        .name = "stop",
        .desc = "some stop",
        .lat = 0.9,
        .lon = 9.0,
        .zone_id = "Zone 51",
        .url = "none",
        .location_type = LT_STOP,
        .parent_station = "",
        .timezone = "Europe/Helsinki",
        .wheelchair_boarding = WB_NOT_SET,
        .level_id = "LVL00",
        .platform_code = "B"
    };

    ASSERT_EQ(1, equal_stop(&a, &b));
    ASSERT_EQ(0, equal_stop(&a, &c));
    ASSERT_EQ(0, equal_stop(&b, &c));

    PASS();
}